

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsFactoryImpl.cpp
# Opt level: O0

unique_ptr<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
__thiscall
jaegertracing::metrics::StatsFactoryImpl::createCounter
          (StatsFactoryImpl *this,string *name,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *tags)

{
  CounterImpl *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RCX;
  Counter *local_60;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *tags_local;
  string *name_local;
  StatsFactoryImpl *this_local;
  
  this_00 = (CounterImpl *)operator_new(0x70);
  anon_unknown_6::CounterImpl::CounterImpl
            (this_00,(StatsReporter *)name->_M_string_length,(string *)tags,in_RCX);
  local_60 = (Counter *)0x0;
  if (this_00 != (CounterImpl *)0x0) {
    local_60 = &this_00->super_Counter;
  }
  std::
  unique_ptr<jaegertracing::metrics::Counter,std::default_delete<jaegertracing::metrics::Counter>>::
  unique_ptr<std::default_delete<jaegertracing::metrics::Counter>,void>
            ((unique_ptr<jaegertracing::metrics::Counter,std::default_delete<jaegertracing::metrics::Counter>>
              *)this,local_60);
  return (__uniq_ptr_data<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>,_true,_true>
          )(__uniq_ptr_data<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Counter> StatsFactoryImpl::createCounter(
    const std::string& name,
    const std::unordered_map<std::string, std::string>& tags)
{
    return std::unique_ptr<Counter>(new CounterImpl(_reporter, name, tags));
}